

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O2

MauResult __thiscall
mau::ProxySession::Inject(ProxySession *this,uint16_t sourcePort,void *datagram,uint bytes)

{
  uint16_t uVar1;
  QueueNode *node;
  OutputWorker *pOVar2;
  MauResult MVar3;
  MauResult MVar4;
  ushort uVar5;
  UDPAddress clientAddress;
  Locker locker;
  undefined1 local_218 [32];
  address local_1f8;
  UDPAddress serverAddress;
  undefined1 local_1b8 [16];
  ostringstream aoStack_1a8 [8];
  unsigned_long local_1a0;
  
  locker.TheLock = &this->APILock;
  std::recursive_mutex::lock(&(locker.TheLock)->cs);
  MVar3 = Mau_Success;
  MVar4 = Mau_Success;
  if (((this->Terminated)._M_base._M_i & 1U) != 0) goto LAB_00108a8a;
  if ((this->super_DeliveryCommonData).ProxyConfig.MaxDatagramBytes < bytes) {
    MVar4 = Mau_InvalidInput;
    goto LAB_00108a8a;
  }
  local_1b8._0_8_ = &(this->super_DeliveryCommonData).ReadBufferAllocator;
  std::recursive_mutex::lock((recursive_mutex *)local_1b8._0_8_);
  node = (QueueNode *)
         pktalloc::Allocator::Allocate
                   (&(this->super_DeliveryCommonData).ReadBufferAllocator.Allocator,bytes + 0x1c);
  Locker::~Locker((Locker *)local_1b8);
  node->Bytes = bytes;
  memcpy(node->Data,datagram,(ulong)bytes);
  LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Get(&serverAddress,&this->ServerAddress);
  uVar1 = swap_bytes(serverAddress.impl_.data_.v4.sin_port);
  MVar4 = MVar3;
  if (uVar1 == sourcePort) {
    DeliveryChannel::InsertQueueNode(&this->S2C,node);
    goto LAB_00108a8a;
  }
  LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Get(&clientAddress,&this->ClientAddress);
  if (clientAddress.impl_.data_.v4.sin_port == 0) {
    local_1b8._0_8_ = (BufferAllocator *)0x100007f00000000;
    local_1a0 = 0;
    local_1b8._8_8_ = 0;
    aoStack_1a8[0] = (ostringstream)0x0;
    aoStack_1a8[1] = (ostringstream)0x0;
    aoStack_1a8[2] = (ostringstream)0x0;
    aoStack_1a8[3] = (ostringstream)0x0;
    aoStack_1a8[4] = (ostringstream)0x0;
    aoStack_1a8[5] = (ostringstream)0x0;
    aoStack_1a8[6] = (ostringstream)0x0;
    aoStack_1a8[7] = (ostringstream)0x0;
    asio::ip::detail::endpoint::endpoint((endpoint *)local_218,(address *)local_1b8,sourcePort);
    clientAddress.impl_.data_._16_4_ = local_218._16_4_;
    clientAddress.impl_.data_._20_4_ = (undefined4)local_218._20_8_;
    clientAddress.impl_.data_.v6.sin6_scope_id = SUB84(local_218._20_8_,4);
    clientAddress.impl_.data_._0_8_ = local_218._0_8_;
    clientAddress.impl_.data_._8_4_ = local_218._8_4_;
    clientAddress.impl_.data_._12_4_ = local_218._12_4_;
    LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set(&this->ClientAddress,&clientAddress);
    LockedValue<asio::ip::basic_endpoint<asio::ip::udp>_>::Set
              (&(this->S2C).DeliveryAddress,&clientAddress);
    DeliveryChannel::InsertQueueNode(&this->C2S,node);
    if (clientAddress.impl_.data_.base.sa_family != 2) {
      local_1f8.ipv6_address_.addr_.__in6_u._0_8_ =
           CONCAT44(clientAddress.impl_.data_._12_4_,clientAddress.impl_.data_._8_4_);
      local_1f8.ipv6_address_.addr_.__in6_u._8_8_ =
           CONCAT44(clientAddress.impl_.data_._20_4_,clientAddress.impl_.data_._16_4_);
      local_1f8.ipv6_address_.scope_id_ = (unsigned_long)clientAddress.impl_.data_.v6.sin6_scope_id;
      local_1f8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_1f8.ipv6_address_.scope_id_ = 0;
      local_1f8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_1f8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_1f8.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(in4_addr_type)clientAddress.impl_.data_.v6.sin6_flowinfo;
    }
    local_1f8.type_ = (anon_enum_32)(clientAddress.impl_.data_.base.sa_family != 2);
    asio::ip::address::to_string_abi_cxx11_((string *)local_218,&local_1f8);
    if ((int)(this->super_DeliveryCommonData).Logger.ChannelMinLevel < 2) {
      local_1b8._0_8_ = (this->super_DeliveryCommonData).Logger.ChannelName;
      uVar5 = swap_bytes(clientAddress.impl_.data_.v4.sin_port);
      local_1b8._8_4_ = 1;
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      std::operator<<((ostream *)aoStack_1a8,
                      (string *)&(this->super_DeliveryCommonData).Logger.Prefix);
      std::operator<<((ostream *)aoStack_1a8,"Inject: Set client address to ");
      std::operator<<((ostream *)aoStack_1a8,(string *)local_218);
      std::operator<<((ostream *)aoStack_1a8," : ");
      std::ostream::operator<<((ostream *)aoStack_1a8,uVar5);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1b8);
LAB_00108a78:
      std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
    }
  }
  else {
    if ((in_port_t)
        (clientAddress.impl_.data_.v4.sin_port << 8 | clientAddress.impl_.data_.v4.sin_port >> 8) ==
        sourcePort) {
      DeliveryChannel::InsertQueueNode(&this->C2S,node);
      goto LAB_00108a8a;
    }
    if (clientAddress.impl_.data_.base.sa_family != 2) {
      local_1f8.ipv6_address_.addr_.__in6_u._0_8_ =
           CONCAT44(clientAddress.impl_.data_._12_4_,clientAddress.impl_.data_._8_4_);
      local_1f8.ipv6_address_.addr_.__in6_u._8_8_ =
           CONCAT44(clientAddress.impl_.data_._20_4_,clientAddress.impl_.data_._16_4_);
      local_1f8.ipv6_address_.scope_id_ = (unsigned_long)clientAddress.impl_.data_.v6.sin6_scope_id;
      local_1f8.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      local_1f8.ipv6_address_.scope_id_ = 0;
      local_1f8.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      local_1f8.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      local_1f8.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(in4_addr_type)clientAddress.impl_.data_.v6.sin6_flowinfo;
    }
    local_1f8.type_ = (anon_enum_32)(clientAddress.impl_.data_.base.sa_family != 2);
    asio::ip::address::to_string_abi_cxx11_((string *)local_218,&local_1f8);
    if ((int)(this->super_DeliveryCommonData).Logger.ChannelMinLevel < 4) {
      local_1b8._0_8_ = (this->super_DeliveryCommonData).Logger.ChannelName;
      uVar5 = swap_bytes(clientAddress.impl_.data_.v4.sin_port);
      local_1b8._8_4_ = 3;
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      std::operator<<((ostream *)aoStack_1a8,
                      (string *)&(this->super_DeliveryCommonData).Logger.Prefix);
      std::operator<<((ostream *)aoStack_1a8,
                      "Inject: Ignored data from unrecognized source address ");
      std::operator<<((ostream *)aoStack_1a8,(string *)local_218);
      std::operator<<((ostream *)aoStack_1a8," : ");
      std::ostream::operator<<((ostream *)aoStack_1a8,uVar5);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1b8);
      goto LAB_00108a78;
    }
  }
  std::__cxx11::string::~string((string *)local_218);
LAB_00108a8a:
  Locker::~Locker(&locker);
  return MVar4;
}

Assistant:

MauResult ProxySession::Inject(
    uint16_t sourcePort, ///< [in] Source port
    const void* datagram, ///< [in] Datagram buffer
    unsigned bytes) ///< [in] Datagram bytes
{
    Locker locker(APILock);

    if (Terminated) {
        return Mau_Success;
    }

    if (bytes > ProxyConfig.MaxDatagramBytes) {
        MAU_DEBUG_BREAK();
        return Mau_InvalidInput;
    }
    uint8_t* readBuffer = ReadBufferAllocator.Allocate(kQueueHeaderSize + bytes);

    QueueNode* queueNode = reinterpret_cast<QueueNode*>(readBuffer);
    queueNode->Bytes = bytes;
    memcpy(&queueNode->Data[0], datagram, bytes);

    const UDPAddress serverAddress = ServerAddress.Get();
    if (sourcePort == serverAddress.port()) {
        S2C.InsertQueueNode(queueNode);
    }
    else
    {
        UDPAddress clientAddress = ClientAddress.Get();
        if (clientAddress.port() == 0)
        {
            clientAddress = UDPAddress(asio::ip::address_v4::loopback(), sourcePort);
            ClientAddress.Set(clientAddress);
            S2C.SetDeliveryAddress(clientAddress);

            C2S.InsertQueueNode(queueNode);

            Logger.Debug("Inject: Set client address to ", clientAddress.address().to_string(), " : ", clientAddress.port());
        }
        else if (clientAddress.port() == sourcePort) {
            C2S.InsertQueueNode(queueNode);
        }
        else {
            Logger.Warning("Inject: Ignored data from unrecognized source address ", clientAddress.address().to_string(), " : ", clientAddress.port());
        }
    }

    return Mau_Success;
}